

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O1

Str * __thiscall
mbc::Val::MessageBook::fullID(Str *__return_storage_ptr__,MessageBook *this,Str *ID)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  pointer pcVar2;
  Str *this_00;
  bool bVar3;
  string *psVar4;
  undefined8 *puVar5;
  _List_node_base *p_Var6;
  string local_88;
  string local_68;
  MessageBook *local_48;
  Str *local_40;
  Str *local_38;
  
  p_Var6 = (_List_node_base *)this->order_;
  local_48 = this;
  local_40 = ID;
  local_38 = __return_storage_ptr__;
  do {
    p_Var6 = (((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)p_Var6)->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    plVar1 = local_48->order_;
    if (p_Var6 == (_List_node_base *)plVar1) goto LAB_0011bd9d;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,p_Var6[1]._M_next,
               (long)&(p_Var6[1]._M_prev)->_M_next + (long)p_Var6[1]._M_next);
    psVar4 = Str::raw_abi_cxx11_(local_40);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + psVar4->_M_string_length);
    bVar3 = units::start_with(&local_88,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    this_00 = local_38;
  } while (!bVar3);
  Str::Str(local_38);
  _ValAtom::set(&this_00->super__ValAtom,(string *)(p_Var6 + 1));
  if (p_Var6 != (_List_node_base *)plVar1) {
    return local_38;
  }
LAB_0011bd9d:
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__exception_00140740;
  __cxa_throw(puVar5,&bad_ID::typeinfo,std::exception::~exception);
}

Assistant:

Str MessageBook::fullID(Str ID) {
    for(auto it = order_ -> begin(); it != order_ -> end(); ++it) {
        if (units::start_with(*it, ID.raw())) {
            Str result;
            result.set(*it);
            return result;
        }
    }
    throw bad_ID();
}